

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backtrace.cpp
# Opt level: O2

void booster::stack_trace::write_symbols(void **addresses,int size,ostream *out)

{
  ostream *poVar1;
  ostream *extraout_RDX;
  ulong uVar2;
  ulong uVar3;
  string tmp;
  
  uVar2 = 0;
  uVar3 = (ulong)(uint)size;
  if (size < 1) {
    uVar3 = uVar2;
  }
  poVar1 = out;
  for (; uVar3 != uVar2; uVar2 = uVar2 + 1) {
    get_symbol_abi_cxx11_(&tmp,(stack_trace *)addresses[uVar2],poVar1);
    if (tmp._M_string_length != 0) {
      poVar1 = std::operator<<(out,(string *)&tmp);
      std::operator<<(poVar1,'\n');
    }
    std::__cxx11::string::~string((string *)&tmp);
    poVar1 = extraout_RDX;
  }
  std::ostream::flush();
  return;
}

Assistant:

void write_symbols(void *const *addresses,int size,std::ostream &out)
        {
            for(int i=0;i<size;i++) {
                std::string tmp = get_symbol(addresses[i]);
                if(!tmp.empty()) {
                    out << tmp << '\n';
                }
            }
            out << std::flush;
        }